

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

broadphase_ptr __thiscall APhyBullet::BulletEngine::createDefaultBroadphase(BulletEngine *this)

{
  long *plVar1;
  void *pvVar2;
  Counter *pCVar3;
  btOverlappingPairCache *in_stack_00000008;
  btDbvtBroadphase *in_stack_00000010;
  btGhostPairCallback *ghostPairCallback;
  btDbvtBroadphase *handle;
  btGhostPairCallback *in_stack_ffffffffffffffb0;
  ref<aphy::broadphase> *this_00;
  btDbvtBroadphase *in_stack_ffffffffffffffb8;
  ref<aphy::broadphase> local_30;
  void *local_28;
  long *local_10;
  
  plVar1 = (long *)::operator_new(0x120);
  btDbvtBroadphase::btDbvtBroadphase(in_stack_00000010,in_stack_00000008);
  local_10 = plVar1;
  pvVar2 = ::operator_new(8);
  btGhostPairCallback::btGhostPairCallback(in_stack_ffffffffffffffb0);
  local_28 = pvVar2;
  plVar1 = (long *)(**(code **)(*local_10 + 0x48))();
  (**(code **)(*plVar1 + 0x78))(plVar1,local_28);
  this_00 = &local_30;
  aphy::makeObject<APhyBullet::BulletBroadphase,btDbvtBroadphase*,btGhostPairCallback*>
            (in_stack_ffffffffffffffb8,(btGhostPairCallback *)this_00);
  pCVar3 = aphy::ref<aphy::broadphase>::disown(this_00);
  aphy::ref<aphy::broadphase>::~ref(this_00);
  return pCVar3;
}

Assistant:

broadphase_ptr BulletEngine::createDefaultBroadphase()
{
    auto handle = new btDbvtBroadphase();
    auto ghostPairCallback = new btGhostPairCallback();
    handle->getOverlappingPairCache()->setInternalGhostPairCallback(ghostPairCallback);
    return makeObject<BulletBroadphase> (handle, ghostPairCallback).disown();
}